

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O0

int lgx_co_checkstack(lgx_co_t *co,uint stack_size)

{
  lgx_co_stack_t *plVar1;
  lgx_value_t *plVar2;
  lgx_value_t *s;
  uint size;
  lgx_value_t *regs;
  lgx_co_stack_t *stack;
  uint stack_size_local;
  lgx_co_t *co_local;
  
  plVar1 = &co->stack;
  plVar2 = plVar1->buf + (co->stack).base;
  if (plVar2->type == T_FUNCTION) {
    if ((co->stack).base + *(int *)&(((plVar2->v).arr)->table).head + stack_size < (co->stack).size)
    {
      co_local._4_4_ = 0;
    }
    else {
      for (s._4_4_ = (co->stack).size;
          s._4_4_ <= (co->stack).base + *(int *)&(((plVar2->v).arr)->table).head + stack_size;
          s._4_4_ = s._4_4_ << 1) {
      }
      if (s._4_4_ < 0x10001) {
        plVar2 = (lgx_value_t *)realloc(plVar1->buf,(ulong)s._4_4_ << 4);
        if (plVar2 == (lgx_value_t *)0x0) {
          co_local._4_4_ = 1;
        }
        else {
          memset(plVar2 + (co->stack).size,0,(ulong)(s._4_4_ - (co->stack).size) << 4);
          plVar1->buf = plVar2;
          (co->stack).size = s._4_4_;
          co_local._4_4_ = 0;
        }
      }
      else {
        co_local._4_4_ = 1;
      }
    }
    return co_local._4_4_;
  }
  __assert_fail("check_type(&regs[0], T_FUNCTION)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                ,499,"int lgx_co_checkstack(lgx_co_t *, unsigned int)");
}

Assistant:

int lgx_co_checkstack(lgx_co_t *co, unsigned int stack_size) {
    lgx_co_stack_t *stack = &co->stack;
    lgx_value_t *regs = &stack->buf[stack->base];

    assert(check_type(&regs[0], T_FUNCTION));

    if (stack->base + regs[0].v.fun->stack_size + stack_size < stack->size) {
        return 0;
    }

    unsigned int size = stack->size;
    while (stack->base + regs[0].v.fun->stack_size + stack_size >= size) {
        size *= 2;
    }

    if (size > LGX_MAX_STACK_SIZE) {
        return 1;
    }

    lgx_value_t *s = (lgx_value_t *)xrealloc(stack->buf, size * sizeof(lgx_value_t));
    if (!s) {
        return 1;
    }
    // 初始化新空间
    memset(s + stack->size, 0, (size - stack->size) * sizeof(lgx_value_t));

    stack->buf = s;
    stack->size = size;

    return 0;
}